

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSequentialImpulseConstraintSolver.cpp
# Opt level: O2

int __thiscall
btSequentialImpulseConstraintSolver::getOrInitSolverBody
          (btSequentialImpulseConstraintSolver *this,btCollisionObject *body,btScalar timeStep)

{
  float fVar1;
  btSolverBody *pbVar2;
  int iVar3;
  btSequentialImpulseConstraintSolver *pbVar4;
  btSolverBody local_118;
  
  iVar3 = body->m_companionId;
  if (iVar3 < 0) {
    if (((body->m_internalType & 2) == 0) ||
       (((fVar1 = body[1].m_interpolationWorldTransform.m_basis.m_el[0].m_floats[1], fVar1 == 0.0 &&
         (!NAN(fVar1))) && ((body->m_collisionFlags & 2) == 0)))) {
      iVar3 = this->m_fixedBodyId;
      if (iVar3 < 0) {
        pbVar4 = (btSequentialImpulseConstraintSolver *)&this->m_tmpSolverBodyPool;
        this->m_fixedBodyId = (this->m_tmpSolverBodyPool).m_size;
        memset(&local_118,0,0xf8);
        pbVar2 = btAlignedObjectArray<btSolverBody>::expand
                           ((btAlignedObjectArray<btSolverBody> *)pbVar4,&local_118);
        initSolverBody(pbVar4,pbVar2,(btCollisionObject *)0x0,timeStep);
        iVar3 = this->m_fixedBodyId;
      }
    }
    else {
      iVar3 = (this->m_tmpSolverBodyPool).m_size;
      pbVar4 = (btSequentialImpulseConstraintSolver *)&this->m_tmpSolverBodyPool;
      memset(&local_118,0,0xf8);
      pbVar2 = btAlignedObjectArray<btSolverBody>::expand
                         ((btAlignedObjectArray<btSolverBody> *)pbVar4,&local_118);
      initSolverBody(pbVar4,pbVar2,body,timeStep);
      body->m_companionId = iVar3;
    }
  }
  return iVar3;
}

Assistant:

btSingleConstraintRowSolver	btSequentialImpulseConstraintSolver::getSSE2ConstraintRowSolverLowerLimit()
 {
	 return gResolveSingleConstraintRowLowerLimit_sse2;
 }